

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

void __thiscall
QDomElementPrivate::setAttribute(QDomElementPrivate *this,QString *aname,QString *newValue)

{
  QDomNodePrivate *pQVar1;
  int iVar2;
  QDomNodePrivate *pQVar3;
  QDomNodePrivate *p;
  QDomDocumentPrivate *doc;
  long in_FS_OFFSET;
  const_iterator local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QString,_QDomNodePrivate_*>::constFindImpl<QString>(&local_48,&this->m_attr->map,aname)
  ;
  if (local_48.e == (Chain **)0x0) {
    pQVar3 = (QDomNodePrivate *)0x0;
  }
  else {
    pQVar3 = (*local_48.e)->value;
  }
  if (pQVar3 == (QDomNodePrivate *)0x0) {
    pQVar3 = (QDomNodePrivate *)operator_new(0xa8);
    doc = (QDomDocumentPrivate *)this;
    do {
      iVar2 = (*(doc->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(doc);
      if ((iVar2 == 9) ||
         (pQVar1 = &doc->super_QDomNodePrivate,
         doc = (QDomDocumentPrivate *)(doc->super_QDomNodePrivate).ownerNode,
         (pQVar1->field_0x98 & 2) == 0)) break;
    } while (doc != (QDomDocumentPrivate *)0x0);
    QDomNodePrivate::QDomNodePrivate(pQVar3,doc,&this->super_QDomNodePrivate);
    pQVar3->_vptr_QDomNodePrivate = (_func_int **)&PTR__QDomNodePrivate_001281a0;
    QString::operator=(&pQVar3->name,aname);
    pQVar3->field_0xa4 = 0;
    (*pQVar3->_vptr_QDomNodePrivate[2])(pQVar3,newValue);
    LOCK();
    (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    QDomNamedNodeMapPrivate::setNamedItem(this->m_attr,pQVar3);
  }
  else {
    (*pQVar3->_vptr_QDomNodePrivate[2])(pQVar3,newValue);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDomElementPrivate::setAttribute(const QString& aname, const QString& newValue)
{
    QDomNodePrivate* n = m_attr->namedItem(aname);
    if (!n) {
        n = new QDomAttrPrivate(ownerDocument(), this, aname);
        n->setNodeValue(newValue);

        // Referencing is done by the map, so we set the reference counter back
        // to 0 here. This is ok since we created the QDomAttrPrivate.
        n->ref.deref();
        m_attr->setNamedItem(n);
    } else {
        n->setNodeValue(newValue);
    }
}